

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldRefIterator<proto2_unittest::ForeignMessage>::
RepeatedFieldRefIterator
          (RepeatedFieldRefIterator<proto2_unittest::ForeignMessage> *this,void *data,
          RepeatedFieldAccessor *accessor,bool begin,AccessorValueType *scratch_space)

{
  void *local_48;
  AccessorValueType *scratch_space_local;
  bool begin_local;
  RepeatedFieldAccessor *accessor_local;
  void *data_local;
  RepeatedFieldRefIterator<proto2_unittest::ForeignMessage> *this_local;
  
  this->data_ = data;
  this->accessor_ = accessor;
  if (begin) {
    local_48 = (void *)(**(code **)(*(long *)accessor + 0x48))(accessor,data);
  }
  else {
    local_48 = (void *)(**(code **)(*(long *)accessor + 0x50))(accessor,data);
  }
  this->iterator_ = local_48;
  std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
  unique_ptr<std::default_delete<google::protobuf::Message>,void>
            ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>> *
             )&this->scratch_space_,scratch_space);
  return;
}

Assistant:

RepeatedFieldRefIterator(
      const void* PROTOBUF_NONNULL data,
      const RepeatedFieldAccessor* PROTOBUF_NONNULL accessor, bool begin,
      AccessorValueType* PROTOBUF_NULLABLE scratch_space)
      : data_(data),
        accessor_(accessor),
        iterator_(begin ? accessor->BeginIterator(data)
                        : accessor->EndIterator(data)),
        scratch_space_(scratch_space) {}